

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindow.cpp
# Opt level: O0

QMenu * __thiscall QMainWindow::createPopupMenu(QMainWindow *this)

{
  byte bVar1;
  bool bVar2;
  qsizetype qVar3;
  QWidget *pQVar4;
  QWidget *pQVar5;
  QDockWidgetGroupWindow *pQVar6;
  long lVar7;
  const_reference ppQVar8;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QToolBar *toolBar;
  int i_1;
  QDockWidgetGroupWindow *dwgw;
  QDockWidget *dockWidget;
  int i;
  QMenu *menu;
  QMainWindowPrivate *d;
  QList<QToolBar_*> toolbars;
  QList<QDockWidget_*> dockwidgets;
  QAction *in_stack_fffffffffffffed8;
  QDockAreaLayoutInfo *in_stack_fffffffffffffee0;
  byte local_111;
  QObject *in_stack_fffffffffffffef0;
  QWidget *in_stack_fffffffffffffef8;
  QDockAreaLayoutInfo *in_stack_ffffffffffffff00;
  undefined6 in_stack_ffffffffffffff08;
  byte in_stack_ffffffffffffff0e;
  byte in_stack_ffffffffffffff0f;
  undefined8 in_stack_ffffffffffffff18;
  QDockAreaLayoutInfo *this_00;
  QFlagsStorage<Qt::FindChildOption> options;
  undefined4 in_stack_ffffffffffffff38;
  int iVar9;
  int local_ac;
  QDockAreaLayoutInfo *local_a8;
  QList<QToolBar_*> local_70 [3];
  QList<QDockWidget_*> local_20;
  long local_8;
  
  options.i = (Int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QMainWindow *)0x5eb2c6);
  local_a8 = (QDockAreaLayoutInfo *)0x0;
  local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.ptr = (QDockWidget **)&DAT_aaaaaaaaaaaaaaaa;
  local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QFlags<Qt::FindChildOption>::QFlags
            ((QFlags<Qt::FindChildOption> *)in_stack_fffffffffffffee0,
             (FindChildOption)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  QObject::findChildren<QDockWidget*>(in_stack_fffffffffffffef0,(FindChildOptions)options.i);
  qVar3 = QList<QDockWidget_*>::size(&local_20);
  if (qVar3 != 0) {
    local_a8 = (QDockAreaLayoutInfo *)operator_new(0x28);
    QMenu::QMenu((QMenu *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    local_ac = 0;
    this_00 = local_a8;
    while( true ) {
      pQVar4 = (QWidget *)(long)local_ac;
      qVar3 = QList<QDockWidget_*>::size(&local_20);
      if (qVar3 <= (long)pQVar4) break;
      QList<QDockWidget_*>::at
                ((QList<QDockWidget_*> *)in_stack_fffffffffffffee0,
                 (qsizetype)in_stack_fffffffffffffed8);
      pQVar5 = QWidget::parentWidget((QWidget *)0x5eb3c6);
      if (pQVar5 == in_RDI) {
        QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eb3e4);
        QDockAreaLayout::indexOf
                  ((QDockAreaLayout *)
                   CONCAT17(in_stack_ffffffffffffff0f,
                            CONCAT16(in_stack_ffffffffffffff0e,in_stack_ffffffffffffff08)),
                   (QWidget *)in_stack_ffffffffffffff00);
        in_stack_ffffffffffffff0f = QList<int>::isEmpty((QList<int> *)0x5eb414);
        QList<int>::~QList((QList<int> *)0x5eb425);
        bVar1 = in_stack_ffffffffffffff0f;
joined_r0x005eb4b4:
        if ((bVar1 & 1) == 0) {
          in_stack_ffffffffffffff00 = local_a8;
          QList<QDockWidget_*>::at
                    ((QList<QDockWidget_*> *)in_stack_fffffffffffffee0,
                     (qsizetype)in_stack_fffffffffffffed8);
          QDockWidget::toggleViewAction((QDockWidget *)in_stack_fffffffffffffee0);
          QWidget::addAction((QWidget *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
        }
      }
      else {
        QWidget::parentWidget((QWidget *)0x5eb443);
        pQVar6 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5eb44b);
        if ((pQVar6 != (QDockWidgetGroupWindow *)0x0) &&
           (pQVar5 = QWidget::parentWidget((QWidget *)0x5eb462), pQVar5 == in_RDI)) {
          QDockWidgetGroupWindow::layoutInfo((QDockWidgetGroupWindow *)0x5eb47b);
          QDockAreaLayoutInfo::indexOf(this_00,pQVar4);
          in_stack_ffffffffffffff0e = QList<int>::isEmpty((QList<int> *)0x5eb49d);
          QList<int>::~QList((QList<int> *)0x5eb4ae);
          bVar1 = in_stack_ffffffffffffff0e;
          goto joined_r0x005eb4b4;
        }
      }
      local_ac = local_ac + 1;
    }
    QMenu::addSeparator((QMenu *)in_stack_fffffffffffffef0);
    options.i = (Int)((ulong)this_00 >> 0x20);
  }
  local_70[0].d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_70[0].d.ptr = (QToolBar **)&DAT_aaaaaaaaaaaaaaaa;
  local_70[0].d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  QFlags<Qt::FindChildOption>::QFlags
            ((QFlags<Qt::FindChildOption> *)in_stack_fffffffffffffee0,
             (FindChildOption)((ulong)in_stack_fffffffffffffed8 >> 0x20));
  QObject::findChildren<QToolBar*>(in_stack_fffffffffffffef0,(FindChildOptions)options.i);
  qVar3 = QList<QToolBar_*>::size(local_70);
  if (qVar3 != 0) {
    if (local_a8 == (QDockAreaLayoutInfo *)0x0) {
      local_a8 = (QDockAreaLayoutInfo *)operator_new(0x28);
      QMenu::QMenu((QMenu *)in_stack_ffffffffffffff00,(QWidget *)local_a8);
    }
    iVar9 = 0;
    while( true ) {
      lVar7 = (long)iVar9;
      qVar3 = QList<QToolBar_*>::size(local_70);
      if (qVar3 <= lVar7) break;
      ppQVar8 = QList<QToolBar_*>::at
                          ((QList<QToolBar_*> *)in_stack_fffffffffffffee0,
                           (qsizetype)in_stack_fffffffffffffed8);
      pQVar4 = &(*ppQVar8)->super_QWidget;
      pQVar5 = QWidget::parentWidget((QWidget *)0x5eb608);
      local_111 = 0;
      if (pQVar5 == in_RDI) {
        QPointer<QMainWindowLayout>::operator->((QPointer<QMainWindowLayout> *)0x5eb634);
        QToolBarAreaLayout::indexOf
                  ((QToolBarAreaLayout *)CONCAT44(iVar9,in_stack_ffffffffffffff38),pQVar4);
        bVar2 = QList<int>::isEmpty((QList<int> *)0x5eb666);
        local_111 = bVar2 ^ 0xff;
        QList<int>::~QList((QList<int> *)0x5eb68a);
      }
      if ((local_111 & 1) != 0) {
        in_stack_fffffffffffffee0 = local_a8;
        QList<QToolBar_*>::at((QList<QToolBar_*> *)local_a8,(qsizetype)in_stack_fffffffffffffed8);
        QToolBar::toggleViewAction((QToolBar *)in_stack_fffffffffffffee0);
        QWidget::addAction((QWidget *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
      }
      iVar9 = iVar9 + 1;
    }
  }
  QList<QToolBar_*>::~QList((QList<QToolBar_*> *)0x5eb6f5);
  QList<QDockWidget_*>::~QList((QList<QDockWidget_*> *)0x5eb702);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QMenu *)local_a8;
}

Assistant:

QMenu *QMainWindow::createPopupMenu()
{
    Q_D(QMainWindow);
    QMenu *menu = nullptr;
#if QT_CONFIG(dockwidget)
    QList<QDockWidget *> dockwidgets = findChildren<QDockWidget *>();
    if (dockwidgets.size()) {
        menu = new QMenu(this);
        for (int i = 0; i < dockwidgets.size(); ++i) {
            QDockWidget *dockWidget = dockwidgets.at(i);
            // filter to find out if we own this QDockWidget
            if (dockWidget->parentWidget() == this) {
                if (d->layout->layoutState.dockAreaLayout.indexOf(dockWidget).isEmpty())
                    continue;
            } else if (QDockWidgetGroupWindow *dwgw =
                           qobject_cast<QDockWidgetGroupWindow *>(dockWidget->parentWidget())) {
                if (dwgw->parentWidget() != this)
                    continue;
                if (dwgw->layoutInfo()->indexOf(dockWidget).isEmpty())
                    continue;
            } else {
                continue;
            }
            menu->addAction(dockwidgets.at(i)->toggleViewAction());
        }
        menu->addSeparator();
    }
#endif // QT_CONFIG(dockwidget)
#if QT_CONFIG(toolbar)
    QList<QToolBar *> toolbars = findChildren<QToolBar *>();
    if (toolbars.size()) {
        if (!menu)
            menu = new QMenu(this);
        for (int i = 0; i < toolbars.size(); ++i) {
            QToolBar *toolBar = toolbars.at(i);
            if (toolBar->parentWidget() == this
                && (!d->layout->layoutState.toolBarAreaLayout.indexOf(toolBar).isEmpty())) {
                menu->addAction(toolbars.at(i)->toggleViewAction());
            }
        }
    }
#endif
    Q_UNUSED(d);
    return menu;
}